

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint ensureBits9(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = reader->bp;
  uVar2 = uVar1 >> 3;
  if (uVar2 + 1 < reader->size) {
    reader->buffer = (uint)(*(ushort *)(reader->data + uVar2) >> ((byte)uVar1 & 7));
    return 1;
  }
  reader->buffer = 0;
  if (uVar2 < reader->size) {
    reader->buffer = (uint)reader->data[uVar2];
  }
  reader->buffer = reader->buffer >> ((byte)uVar1 & 7);
  return (uint)(nbits + uVar1 <= reader->bitsize);
}

Assistant:

static unsigned ensureBits9(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if (start + 1u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u);
    reader->buffer >>= (reader->bp & 7u);
    return 1;
  }
  else {
    reader->buffer = 0;
    if (start + 0u < size) reader->buffer |= reader->data[start + 0];
    reader->buffer >>= (reader->bp & 7u);
    return reader->bp + nbits <= reader->bitsize;
  }
}